

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

Expression
dynet::detail::f<dynet::Sum,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
          (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *xs)

{
  pointer *pppNVar1;
  uint uVar2;
  ComputationGraph *this;
  pointer pEVar3;
  iterator __position;
  VariableIndex VVar4;
  pointer pEVar5;
  Node *pNVar6;
  VariableIndex *pVVar7;
  Expression EVar8;
  VariableIndex new_node_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  allocator_type local_3d;
  VariableIndex local_3c;
  Node *local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  pEVar5 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this = pEVar5->pg;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_30,
             (long)(xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pEVar5 >> 4,
             (allocator_type *)&local_38);
  pEVar3 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar7 = local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pEVar5 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar3; pEVar5 = pEVar5 + 1) {
    *pVVar7 = pEVar5->i;
    pVVar7 = pVVar7 + 1;
  }
  local_3c = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pNVar6 = (Node *)operator_new(0x60);
  pNVar6->_vptr_Node = (_func_int **)&PTR__Node_005bafc8;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pNVar6->args,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_3d);
  (pNVar6->dim).nd = 0;
  (pNVar6->dim).bd = 1;
  pNVar6->device = (Device *)0x0;
  pNVar6->_vptr_Node = (_func_int **)&PTR__Node_005bc378;
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = pNVar6;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar6;
    pppNVar1 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->device = dynet::default_device;
  ComputationGraph::set_dim_for_new_node(this,&local_3c);
  VVar4 = local_3c;
  uVar2 = this->graph_id;
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  EVar8.graph_id = uVar2;
  EVar8.i = VVar4;
  EVar8.pg = this;
  return EVar8;
}

Assistant:

Expression f(const T& xs) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis));
}